

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

uint llbuild::basic::sys::sleep(uint __seconds)

{
  uint uVar1;
  int seconds_local;
  
  uVar1 = ::sleep(__seconds);
  return uVar1;
}

Assistant:

void sys::sleep(int seconds) {
#if defined(_WIN32)
  // Uses milliseconds
  Sleep(seconds * 1000);
#else
  ::sleep(seconds);
#endif
}